

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

KeyInfo * multiSelectOrderByKeyInfo(Parse *pParse,Select *p,int nExtra)

{
  ExprList *pEVar1;
  sqlite3 *db;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  Expr *pEVar4;
  uint uVar5;
  ulong uVar6;
  ExprList_item *pEVar7;
  
  pEVar1 = p->pOrderBy;
  if (pEVar1 == (ExprList *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = pEVar1->nExpr;
  }
  db = pParse->db;
  pKVar2 = sqlite3KeyInfoAlloc(db,uVar5 + 1,1);
  if (0 < (int)uVar5 && pKVar2 != (KeyInfo *)0x0) {
    pEVar7 = pEVar1->a;
    uVar6 = 0;
    do {
      pEVar4 = pEVar7->pExpr;
      if ((pEVar4->flags & 0x200) == 0) {
        pCVar3 = multiSelectCollSeq(pParse,p,(pEVar7->u).x.iOrderByCol - 1);
        if (pCVar3 == (CollSeq *)0x0) {
          pCVar3 = db->pDfltColl;
        }
        pEVar4 = sqlite3ExprAddCollateString(pParse,pEVar4,pCVar3->zName);
        pEVar7->pExpr = pEVar4;
      }
      else {
        pCVar3 = sqlite3ExprCollSeq(pParse,pEVar4);
      }
      pKVar2->aColl[uVar6] = pCVar3;
      pKVar2->aSortFlags[uVar6] = (pEVar7->fg).sortFlags;
      uVar6 = uVar6 + 1;
      pEVar7 = pEVar7 + 1;
    } while (uVar5 != uVar6);
  }
  return pKVar2;
}

Assistant:

static KeyInfo *multiSelectOrderByKeyInfo(Parse *pParse, Select *p, int nExtra){
  ExprList *pOrderBy = p->pOrderBy;
  int nOrderBy = ALWAYS(pOrderBy!=0) ? pOrderBy->nExpr : 0;
  sqlite3 *db = pParse->db;
  KeyInfo *pRet = sqlite3KeyInfoAlloc(db, nOrderBy+nExtra, 1);
  if( pRet ){
    int i;
    for(i=0; i<nOrderBy; i++){
      struct ExprList_item *pItem = &pOrderBy->a[i];
      Expr *pTerm = pItem->pExpr;
      CollSeq *pColl;

      if( pTerm->flags & EP_Collate ){
        pColl = sqlite3ExprCollSeq(pParse, pTerm);
      }else{
        pColl = multiSelectCollSeq(pParse, p, pItem->u.x.iOrderByCol-1);
        if( pColl==0 ) pColl = db->pDfltColl;
        pOrderBy->a[i].pExpr =
          sqlite3ExprAddCollateString(pParse, pTerm, pColl->zName);
      }
      assert( sqlite3KeyInfoIsWriteable(pRet) );
      pRet->aColl[i] = pColl;
      pRet->aSortFlags[i] = pOrderBy->a[i].fg.sortFlags;
    }
  }

  return pRet;
}